

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

void __thiscall crnlib::dxt1_block::flip_y(dxt1_block *this,uint w,uint h)

{
  uint val;
  uint val_00;
  undefined4 local_20;
  uint c;
  uint x;
  uint y;
  uint h_local;
  uint w_local;
  dxt1_block *this_local;
  
  for (c = 0; c < h >> 1; c = c + 1) {
    for (local_20 = 0; local_20 < w; local_20 = local_20 + 1) {
      val = get_selector(this,local_20,c);
      val_00 = get_selector(this,local_20,(h - 1) - c);
      set_selector(this,local_20,c,val_00);
      set_selector(this,local_20,(h - 1) - c,val);
    }
  }
  return;
}

Assistant:

inline void flip_y(uint w = 4, uint h = 4)
        {
            for (uint y = 0; y < (h / 2); y++)
            {
                for (uint x = 0; x < w; x++)
                {
                    const uint c = get_selector(x, y);
                    set_selector(x, y, get_selector(x, (h - 1) - y));
                    set_selector(x, (h - 1) - y, c);
                }
            }
        }